

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<char(&)[46],char,unsigned_short>
          (String *__return_storage_ptr__,kj *this,char (*params) [46],char *params_1,
          unsigned_short *params_2)

{
  char (*value) [46];
  char *value_00;
  unsigned_short *value_01;
  CappedArray<char,_8UL> local_50;
  char local_39 [1];
  ArrayPtr<const_char> local_38;
  NoInfer<unsigned_short> *local_28;
  unsigned_short *params_local_2;
  char *params_local_1;
  char (*params_local) [46];
  
  local_28 = (NoInfer<unsigned_short> *)params_1;
  params_local_2 = (unsigned_short *)params;
  params_local_1 = (char *)this;
  params_local = (char (*) [46])__return_storage_ptr__;
  value = char((char (*) [46])this);
  local_38 = toCharSequence<char(&)[46]>(value);
  value_00 = fwd<char>((NoInfer<char> *)params_local_2);
  local_39[0] = (char)toCharSequence<char>(value_00);
  value_01 = fwd<unsigned_short>(local_28);
  local_50 = toCharSequence<unsigned_short>(value_01);
  _::concat<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::CappedArray<char,8ul>>
            (__return_storage_ptr__,(_ *)&local_38,(ArrayPtr<const_char> *)local_39,
             (FixedArray<char,_1UL> *)&local_50,(CappedArray<char,_8UL> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}